

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<std::basic_string_view<unsigned_char,std::char_traits<unsigned_char>>,void>
               (basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> *container,
               ostream *os)

{
  const_iterator pvVar1;
  value_type_conflict4 *elem;
  const_iterator __end0;
  const_iterator __begin0;
  basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> *)0x0;
  __end0 = std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>::begin(container)
  ;
  pvVar1 = std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>::end(container);
  do {
    if (__end0 == pvVar1) {
LAB_004f2997:
      if (__range3 != (basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((__range3 != (basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> *)0x0) &&
       (std::operator<<(os,','),
       __range3 == (basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_004f2997;
    }
    std::operator<<(os,' ');
    UniversalPrint<unsigned_char>(__end0,os);
    __range3 = (basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> *)
               ((long)&__range3->_M_len + 1);
    __end0 = __end0 + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }